

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::UnitTest::AddTestPartResult
          (UnitTest *this,Type result_type,char *file_name,int line_number,String *message,
          String *os_stack_trace)

{
  pointer pTVar1;
  vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_> *pvVar2;
  Message *pMVar3;
  TestPartResultReporterInterface *pTVar4;
  GoogleTestFailureException *this_00;
  pointer pTVar5;
  ulong uVar6;
  long lVar7;
  Message msg;
  MutexLock lock;
  String local_80;
  TestPartResult result;
  
  Message::Message(&msg);
  Message::operator<<(&msg,message);
  lock.mutex_ = &(this->mutex_).super_MutexBase;
  internal::MutexBase::Lock(lock.mutex_);
  pvVar2 = internal::
           ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
           ::GetOrCreateValue(&this->impl_->gtest_trace_stack_);
  pTVar5 = (pvVar2->
           super__Vector_base<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar5 != (pvVar2->
                super__Vector_base<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>
                )._M_impl.super__Vector_impl_data._M_start) {
    pMVar3 = Message::operator<<(&msg,(char (*) [2])0x13a003);
    pMVar3 = Message::operator<<(pMVar3,(char (*) [12])"Google Test");
    Message::operator<<(pMVar3,(char (*) [8])" trace:");
    pvVar2 = internal::
             ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
             ::GetOrCreateValue(&this->impl_->gtest_trace_stack_);
    uVar6 = (long)(pvVar2->
                  super__Vector_base<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(pvVar2->
                  super__Vector_base<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    lVar7 = (uVar6 & 0x1fffffffe0) - 0x10;
    for (uVar6 = uVar6 >> 5; 0 < (int)uVar6; uVar6 = (ulong)((int)uVar6 - 1)) {
      pvVar2 = internal::
               ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
               ::GetOrCreateValue(&this->impl_->gtest_trace_stack_);
      pTVar1 = (pvVar2->
               super__Vector_base<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pMVar3 = Message::operator<<(&msg,(char (*) [2])0x13a003);
      internal::FormatFileLocation_abi_cxx11_
                ((string *)&result,*(internal **)((long)pTVar1 + lVar7 + -0x10),
                 (char *)(ulong)*(uint *)((long)pTVar1 + lVar7 + -8),(int)pTVar5);
      pMVar3 = Message::operator<<(pMVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&result);
      pMVar3 = Message::operator<<(pMVar3,(char (*) [2])0x13a7ea);
      Message::operator<<(pMVar3,(String *)((long)&pTVar1->file + lVar7));
      std::__cxx11::string::~string((string *)&result);
      lVar7 = lVar7 + -0x20;
    }
  }
  if ((os_stack_trace->c_str_ != (char *)0x0) && (os_stack_trace->length_ != 0)) {
    pMVar3 = Message::operator<<(&msg,(char (*) [15])"\nStack trace:\n");
    Message::operator<<(pMVar3,os_stack_trace);
  }
  internal::StringStreamToString((internal *)&local_80,(stringstream *)msg.ss_.ptr_);
  TestPartResult::TestPartResult(&result,result_type,file_name,line_number,local_80.c_str_);
  internal::String::~String(&local_80);
  pTVar4 = internal::UnitTestImpl::GetTestPartResultReporterForCurrentThread(this->impl_);
  (*pTVar4->_vptr_TestPartResultReporterInterface[2])(pTVar4,&result);
  if (result_type != kSuccess) {
    if (FLAGS_gtest_break_on_failure == '\x01') {
      _DAT_00000000 = 1;
    }
    else if (FLAGS_gtest_throw_on_failure == '\x01') {
      this_00 = (GoogleTestFailureException *)__cxa_allocate_exception(0x10);
      GoogleTestFailureException::GoogleTestFailureException(this_00,&result);
      __cxa_throw(this_00,&GoogleTestFailureException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  TestPartResult::~TestPartResult(&result);
  internal::GTestMutexLock::~GTestMutexLock(&lock);
  internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&msg.ss_);
  return;
}

Assistant:

void UnitTest::AddTestPartResult(TestPartResult::Type result_type,
                                 const char* file_name,
                                 int line_number,
                                 const internal::String& message,
                                 const internal::String& os_stack_trace) {
  Message msg;
  msg << message;

  internal::MutexLock lock(&mutex_);
  if (impl_->gtest_trace_stack().size() > 0) {
    msg << "\n" << GTEST_NAME_ << " trace:";

    for (int i = static_cast<int>(impl_->gtest_trace_stack().size());
         i > 0; --i) {
      const internal::TraceInfo& trace = impl_->gtest_trace_stack()[i - 1];
      msg << "\n" << internal::FormatFileLocation(trace.file, trace.line)
          << " " << trace.message;
    }
  }

  if (os_stack_trace.c_str() != NULL && !os_stack_trace.empty()) {
    msg << internal::kStackTraceMarker << os_stack_trace;
  }

  const TestPartResult result =
    TestPartResult(result_type, file_name, line_number,
                   msg.GetString().c_str());
  impl_->GetTestPartResultReporterForCurrentThread()->
      ReportTestPartResult(result);

  if (result_type != TestPartResult::kSuccess) {
    // gtest_break_on_failure takes precedence over
    // gtest_throw_on_failure.  This allows a user to set the latter
    // in the code (perhaps in order to use Google Test assertions
    // with another testing framework) and specify the former on the
    // command line for debugging.
    if (GTEST_FLAG(break_on_failure)) {
#if GTEST_OS_WINDOWS
      // Using DebugBreak on Windows allows gtest to still break into a debugger
      // when a failure happens and both the --gtest_break_on_failure and
      // the --gtest_catch_exceptions flags are specified.
      DebugBreak();
#else
      // Dereference NULL through a volatile pointer to prevent the compiler
      // from removing. We use this rather than abort() or __builtin_trap() for
      // portability: Symbian doesn't implement abort() well, and some debuggers
      // don't correctly trap abort().
      *static_cast<volatile int*>(NULL) = 1;
#endif  // GTEST_OS_WINDOWS
    } else if (GTEST_FLAG(throw_on_failure)) {
#if GTEST_HAS_EXCEPTIONS
      throw GoogleTestFailureException(result);
#else
      // We cannot call abort() as it generates a pop-up in debug mode
      // that cannot be suppressed in VC 7.1 or below.
      exit(1);
#endif
    }
  }
}